

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O0

void print_count_report(ostream *out)

{
  ostream *poVar1;
  void *pvVar2;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Statistics:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," sync_bad_count =");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,sync_bad_count);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," async_bad_count =");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,async_bad_count);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," count_timeouts =");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,count_timeouts);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," above 15 =");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,above_3to);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," below 10 =");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,below_2to);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1," eof =");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(eof_detected & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_count_report(std::ostream &out)
{
	out 	<< "Statistics:" << std::endl
		<< " sync_bad_count =" << sync_bad_count << std::endl
		<< " async_bad_count =" << async_bad_count << std::endl
		<< " count_timeouts =" << count_timeouts << std::endl
		<< " above 15 =" << above_3to << std::endl
		<< " below 10 =" << below_2to << std::endl
		<< " eof =" << eof_detected << std::endl;
}